

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

Image * __thiscall
phosg::BitmapImage::to_color
          (Image *__return_storage_ptr__,BitmapImage *this,uint32_t false_color,uint32_t true_color,
          bool add_alpha)

{
  uint32_t color;
  ulong uVar1;
  ulong uVar2;
  uint8_t uVar3;
  size_t z;
  ulong uVar4;
  size_t y;
  ulong y_00;
  ulong uVar5;
  
  Image::Image(__return_storage_ptr__,this->width,this->height,add_alpha,'\b');
  for (y_00 = 0; y_00 < this->height; y_00 = y_00 + 1) {
    uVar1 = this->width;
    for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 8) {
      uVar3 = this->data[(uVar5 >> 3) + this->row_bytes * y_00];
      uVar4 = 0;
      while( true ) {
        uVar2 = uVar1 - uVar5;
        if (7 < uVar1 - uVar5) {
          uVar2 = 8;
        }
        if (uVar2 <= uVar4) break;
        color = false_color;
        if ((char)uVar3 < '\0') {
          color = true_color;
        }
        Image::write_pixel(__return_storage_ptr__,uVar5 + uVar4,y_00,color);
        uVar3 = uVar3 * '\x02';
        uVar4 = uVar4 + 1;
        uVar1 = this->width;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image BitmapImage::to_color(uint32_t false_color, uint32_t true_color, bool add_alpha) const {
  Image ret(this->width, this->height, add_alpha);
  for (size_t y = 0; y < this->height; y++) {
    for (size_t x = 0; x < this->width; x += 8) {
      uint8_t pending_bits = this->data[(y * this->row_bytes) + (x >> 3)];
      for (size_t z = 0; z < std::min<size_t>(this->width - x, 8); z++) {
        ret.write_pixel(x + z, y, (pending_bits & 0x80) ? true_color : false_color);
        pending_bits <<= 1;
      }
    }
  }
  return ret;
}